

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__instance_camera
          (NodeLoader *this,instance_camera__AttributeData *attributeData)

{
  Node *pNVar1;
  _Elt_pointer ppNVar2;
  UniqueId *pUVar3;
  UniqueId instantiatedCameraUniqueId;
  UniqueId instanceCameraUniqueId;
  InstanceCamera *instanceCamera;
  
  ppNVar2 = (this->mNodeStack).c.
            super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppNVar2 ==
      (this->mNodeStack).c.super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppNVar2 = (this->mNodeStack).c.
              super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pNVar1 = ppNVar2[-1];
  pUVar3 = IFilePartLoader::createUniqueIdFromUrl
                     (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->
                       super_IFilePartLoader,&attributeData->url,CAMERA,false);
  instantiatedCameraUniqueId.mClassId = pUVar3->mClassId;
  instantiatedCameraUniqueId._4_4_ = *(undefined4 *)&pUVar3->field_0x4;
  instantiatedCameraUniqueId.mObjectId = pUVar3->mObjectId;
  instantiatedCameraUniqueId.mFileId = pUVar3->mFileId;
  IFilePartLoader::createUniqueId
            (&instanceCameraUniqueId,
             &((this->super_HelperLoaderBase).mHandlingFilePartLoader)->super_IFilePartLoader,
             INSTANCE_CAMERA);
  instanceCamera = (InstanceCamera *)operator_new(0x58);
  (instanceCamera->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)430>).mUniqueId.mFileId =
       instanceCameraUniqueId.mFileId;
  (instanceCamera->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)430>).mUniqueId.mClassId =
       instanceCameraUniqueId.mClassId;
  *(undefined4 *)
   &(instanceCamera->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)430>).mUniqueId.
    field_0x4 = instanceCameraUniqueId._4_4_;
  (instanceCamera->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)430>).mUniqueId.mObjectId
       = instanceCameraUniqueId.mObjectId;
  (instanceCamera->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)430>).super_Object.
  _vptr_Object = (_func_int **)&PTR__InstanceBase_00a03960;
  (instanceCamera->mName)._M_dataplus._M_p = (pointer)&(instanceCamera->mName).field_2;
  (instanceCamera->mName)._M_string_length = 0;
  (instanceCamera->mName).field_2._M_local_buf[0] = '\0';
  (instanceCamera->mInstanciatedObjectId).mClassId = instantiatedCameraUniqueId.mClassId;
  *(undefined4 *)&(instanceCamera->mInstanciatedObjectId).field_0x4 =
       instantiatedCameraUniqueId._4_4_;
  (instanceCamera->mInstanciatedObjectId).mObjectId = instantiatedCameraUniqueId.mObjectId;
  (instanceCamera->mInstanciatedObjectId).mFileId = instantiatedCameraUniqueId.mFileId;
  COLLADAFW::ArrayPrimitiveType<COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)430>_*>::
  append(&(pNVar1->mInstanceCameras).
          super_ArrayPrimitiveType<COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)430>_*>
         ,&instanceCamera);
  COLLADAFW::UniqueId::~UniqueId(&instanceCameraUniqueId);
  COLLADAFW::UniqueId::~UniqueId(&instantiatedCameraUniqueId);
  return true;
}

Assistant:

bool NodeLoader::begin__instance_camera( const instance_camera__AttributeData& attributeData )
	{
        COLLADAFW::Node* currentNode = mNodeStack.top();
		COLLADAFW::UniqueId instantiatedCameraUniqueId = getHandlingFilePartLoader()->createUniqueIdFromUrl( attributeData.url, COLLADAFW::Camera::ID() );

        COLLADAFW::UniqueId instanceCameraUniqueId = getHandlingFilePartLoader()->createUniqueId( COLLADAFW::InstanceCamera::ID() );
		COLLADAFW::InstanceCamera* instanceCamera = FW_NEW COLLADAFW::InstanceCamera(instanceCameraUniqueId, instantiatedCameraUniqueId);
		currentNode->getInstanceCameras().append(instanceCamera);

		return true;
	}